

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void constructor(LexState *ls,expdesc *t)

{
  uint uVar1;
  FuncState *fs;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ConsControl local_60;
  
  fs = ls->fs;
  iVar4 = ls->linenumber;
  iVar2 = luaK_codeABC(fs,OP_NEWTABLE,0,0,0);
  local_60.tostore = 0;
  local_60.nh = 0;
  local_60.na = 0;
  t->t = -1;
  t->f = -1;
  t->k = VRELOCABLE;
  (t->u).info = iVar2;
  local_60.v.t = -1;
  local_60.v.f = -1;
  local_60.v.k = VVOID;
  local_60.v.u.info = 0;
  local_60.t = t;
  luaK_exp2nextreg(ls->fs,t);
  checknext(ls,0x7b);
  iVar3 = (ls->t).token;
  if (iVar3 != 0x7d) {
    do {
      if (local_60.v.k != VVOID) {
        luaK_exp2nextreg(fs,&local_60.v);
        local_60.v.k = VVOID;
        if (local_60.tostore == 0x32) {
          luaK_setlist(fs,((local_60.t)->u).info,local_60.na,0x32);
          local_60.tostore = 0;
        }
        iVar3 = (ls->t).token;
      }
      if (iVar3 == 0x5b) {
LAB_0011477a:
        recfield(ls,&local_60);
      }
      else {
        if (iVar3 == 0x124) {
          iVar3 = luaX_lookahead(ls);
          if (iVar3 == 0x3d) goto LAB_0011477a;
        }
        subexpr(ls,&local_60.v,0);
        local_60.na = local_60.na + 1;
        local_60.tostore = local_60.tostore + 1;
      }
      iVar3 = (ls->t).token;
      if ((iVar3 != 0x3b) && (iVar3 != 0x2c)) break;
      luaX_next(ls);
      iVar3 = (ls->t).token;
    } while (iVar3 != 0x7d);
  }
  check_match(ls,0x7d,0x7b,iVar4);
  if (local_60.tostore != 0) {
    if (local_60.v.k - VCALL < 2) {
      luaK_setreturns(fs,&local_60.v,-1);
      luaK_setlist(fs,((local_60.t)->u).info,local_60.na,-1);
      local_60.na = local_60.na - 1;
    }
    else {
      if (local_60.v.k != VVOID) {
        luaK_exp2nextreg(fs,&local_60.v);
      }
      luaK_setlist(fs,((local_60.t)->u).info,local_60.na,local_60.tostore);
    }
  }
  uVar1 = fs->f->code[iVar2];
  iVar4 = luaO_int2fb(local_60.na);
  fs->f->code[iVar2] = iVar4 << 0x17 | uVar1 & 0x7fffff;
  uVar5 = luaO_int2fb(local_60.nh);
  fs->f->code[iVar2] = (uVar5 & 0x1ff) << 0xe | iVar4 << 0x17 | uVar1 & 0x3fff;
  return;
}

Assistant:

static void constructor(LexState *ls, expdesc *t) {
    /* constructor -> '{' [ field { sep field } [sep] ] '}'
       sep -> ',' | ';' */
    FuncState *fs = ls->fs;
    int line = ls->linenumber;
    int pc = luaK_codeABC(fs, OP_NEWTABLE, 0, 0, 0);
    struct ConsControl cc;
    cc.na = cc.nh = cc.tostore = 0;
    cc.t = t;
    init_exp(t, VRELOCABLE, pc);
    init_exp(&cc.v, VVOID, 0);  /* no value (yet) */
    luaK_exp2nextreg(ls->fs, t);  /* fix it at stack top */
    checknext(ls, '{');
    do {
        lua_assert(cc.v.k == VVOID || cc.tostore > 0);
        if (ls->t.token == '}') break;
        closelistfield(fs, &cc);
        field(ls, &cc);
    } while (testnext(ls, ',') || testnext(ls, ';'));
    check_match(ls, '}', '{', line);
    lastlistfield(fs, &cc);
    SETARG_B(fs->f->code[pc], luaO_int2fb(cc.na)); /* set initial array size */
    SETARG_C(fs->f->code[pc], luaO_int2fb(cc.nh));  /* set initial table size */
}